

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O2

void calc0<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options2 *opt)

{
  string *__lhs;
  long lVar1;
  bool bVar2;
  type_conflict6 tVar3;
  ostream *poVar4;
  invalid_argument *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_448;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  real_t Jy;
  real_t Jx;
  real_t beta;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_268;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_218;
  square local_1c8 [8];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [2];
  int local_188;
  undefined1 local_184;
  fpclass_type local_180;
  int32_t iStack_17c;
  cpp_dec_float<100U,_int,_void> local_178;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_128;
  tc local_d8 [8];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t iStack_8c;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  f;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jx,&opt->Jx);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jy,&opt->Jy);
  local_448.m_backend.data._M_elems[0xc] = 0;
  local_448.m_backend.data._M_elems[0xd] = 0;
  local_448.m_backend.data._M_elems._56_5_ = 0;
  local_448.m_backend.data._M_elems[8] = 0;
  local_448.m_backend.data._M_elems[9] = 0;
  local_448.m_backend.data._M_elems[10] = 0;
  local_448.m_backend.data._M_elems[0xb] = 0;
  local_448.m_backend.data._M_elems[4] = 0;
  local_448.m_backend.data._M_elems[5] = 0;
  local_448.m_backend.data._M_elems[6] = 0;
  local_448.m_backend.data._M_elems[7] = 0;
  local_448.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_448.m_backend.exp = 0;
  local_448.m_backend.neg = false;
  local_448.m_backend.data._M_elems[0] = 0;
  local_448.m_backend.data._M_elems[1] = 0;
  local_448.m_backend.data._M_elems[2] = 0;
  local_448.m_backend.data._M_elems[3] = 0;
  local_3f8.base.m_backend.data._M_elems[0xc] = 0;
  local_3f8.base.m_backend.data._M_elems[0xd] = 0;
  local_3f8.base.m_backend.data._M_elems._56_5_ = 0;
  local_3f8.base.m_backend.data._M_elems[8] = 0;
  local_3f8.base.m_backend.data._M_elems[9] = 0;
  local_3f8.base.m_backend.data._M_elems[10] = 0;
  local_3f8.base.m_backend.data._M_elems[0xb] = 0;
  local_3f8.base.m_backend.data._M_elems[4] = 0;
  local_3f8.base.m_backend.data._M_elems[5] = 0;
  local_3f8.base.m_backend.data._M_elems[6] = 0;
  local_3f8.base.m_backend.data._M_elems[7] = 0;
  local_3f8.base.m_backend.data._M_elems[0] = 0;
  local_3f8.base.m_backend.data._M_elems[1] = 0;
  local_3f8.base.m_backend.data._M_elems[2] = 0;
  local_3f8.base.m_backend.data._M_elems[3] = 0;
  local_3f8.base.m_backend.data._M_elems[0xf]._1_3_ = 0;
  local_3f8.base.m_backend.exp = 0;
  local_3f8.base.m_backend.neg = false;
  local_3a8.data._M_elems[0xc] = 0;
  local_3a8.data._M_elems[0xd] = 0;
  local_3a8.data._M_elems._56_5_ = 0;
  local_3a8.data._M_elems[8] = 0;
  local_3a8.data._M_elems[9] = 0;
  local_3a8.data._M_elems[10] = 0;
  local_3a8.data._M_elems[0xb] = 0;
  local_3a8.data._M_elems[4] = 0;
  local_3a8.data._M_elems[5] = 0;
  local_3a8.data._M_elems[6] = 0;
  local_3a8.data._M_elems[7] = 0;
  local_3a8.data._M_elems[0] = 0;
  local_3a8.data._M_elems[1] = 0;
  local_3a8.data._M_elems[2] = 0;
  local_3a8.data._M_elems[3] = 0;
  local_3a8.data._M_elems[0xf]._1_3_ = 0;
  local_3a8.exp = 0;
  local_3a8.neg = false;
  __lhs = &opt->Tmin;
  bVar2 = std::operator==(__lhs,"tc");
  if (bVar2) {
LAB_0011900f:
    local_d8 = (tc  [8])Jx.base.m_backend.data._M_elems._0_8_;
    auStack_d0[0] = Jx.base.m_backend.data._M_elems[2];
    auStack_d0[1] = Jx.base.m_backend.data._M_elems[3];
    local_c8[0] = Jx.base.m_backend.data._M_elems[4];
    local_c8[1] = Jx.base.m_backend.data._M_elems[5];
    auStack_c0[0] = Jx.base.m_backend.data._M_elems[6];
    auStack_c0[1] = Jx.base.m_backend.data._M_elems[7];
    local_b8[0] = Jx.base.m_backend.data._M_elems[8];
    local_b8[1] = Jx.base.m_backend.data._M_elems[9];
    auStack_b0[0] = Jx.base.m_backend.data._M_elems[10];
    auStack_b0[1] = Jx.base.m_backend.data._M_elems[0xb];
    local_a8[0] = Jx.base.m_backend.data._M_elems[0xc];
    local_a8[1] = Jx.base.m_backend.data._M_elems[0xd];
    auStack_a0[0] = Jx.base.m_backend.data._M_elems[0xe];
    auStack_a0[1] = Jx.base.m_backend.data._M_elems[0xf];
    local_98 = Jx.base.m_backend.exp;
    local_94 = Jx.base.m_backend.neg;
    local_90 = Jx.base.m_backend.fpclass;
    iStack_8c = Jx.base.m_backend.prec_elem;
    local_128.base.m_backend.data._M_elems[0] = Jy.base.m_backend.data._M_elems[0];
    local_128.base.m_backend.data._M_elems[1] = Jy.base.m_backend.data._M_elems[1];
    local_128.base.m_backend.data._M_elems[2] = Jy.base.m_backend.data._M_elems[2];
    local_128.base.m_backend.data._M_elems[3] = Jy.base.m_backend.data._M_elems[3];
    local_128.base.m_backend.data._M_elems[4] = Jy.base.m_backend.data._M_elems[4];
    local_128.base.m_backend.data._M_elems[5] = Jy.base.m_backend.data._M_elems[5];
    local_128.base.m_backend.data._M_elems[6] = Jy.base.m_backend.data._M_elems[6];
    local_128.base.m_backend.data._M_elems[7] = Jy.base.m_backend.data._M_elems[7];
    local_128.base.m_backend.data._M_elems[8] = Jy.base.m_backend.data._M_elems[8];
    local_128.base.m_backend.data._M_elems[9] = Jy.base.m_backend.data._M_elems[9];
    local_128.base.m_backend.data._M_elems[10] = Jy.base.m_backend.data._M_elems[10];
    local_128.base.m_backend.data._M_elems[0xb] = Jy.base.m_backend.data._M_elems[0xb];
    local_128.base.m_backend.data._M_elems[0xc] = Jy.base.m_backend.data._M_elems[0xc];
    local_128.base.m_backend.data._M_elems[0xd] = Jy.base.m_backend.data._M_elems[0xd];
    local_128.base.m_backend.data._M_elems[0xe] = Jy.base.m_backend.data._M_elems[0xe];
    local_128.base.m_backend.data._M_elems[0xf] = Jy.base.m_backend.data._M_elems[0xf];
    local_128.base.m_backend.exp = Jy.base.m_backend.exp;
    local_128.base.m_backend.neg = Jy.base.m_backend.neg;
    local_128.base.m_backend.fpclass = Jy.base.m_backend.fpclass;
    local_128.base.m_backend.prec_elem = Jy.base.m_backend.prec_elem;
    ising::tc::
    square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_178,local_d8,&local_128,in_RCX);
    local_3a8.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_3a8.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_3a8.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
    local_3a8.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
    local_3a8.data._M_elems[8] = local_178.data._M_elems[8];
    local_3a8.data._M_elems[9] = local_178.data._M_elems[9];
    local_3a8.data._M_elems[10] = local_178.data._M_elems[10];
    local_3a8.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_3a8.data._M_elems[4] = local_178.data._M_elems[4];
    local_3a8.data._M_elems[5] = local_178.data._M_elems[5];
    local_3a8.data._M_elems[6] = local_178.data._M_elems[6];
    local_3a8.data._M_elems[7] = local_178.data._M_elems[7];
    local_3a8.data._M_elems[2] = local_178.data._M_elems[2];
    local_3a8.data._M_elems[3] = local_178.data._M_elems[3];
    local_3a8.exp = local_178.exp;
    local_3a8.neg = local_178.neg;
    local_3a8.fpclass = local_178.fpclass;
    local_3a8.prec_elem = local_178.prec_elem;
    local_3f8.base.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
    local_3f8.base.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
    local_3f8.base.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
    local_3f8.base.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
    local_3f8.base.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
    local_3f8.base.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
    local_3f8.base.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
    local_3f8.base.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
    local_3f8.base.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
    local_3f8.base.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
    local_3f8.base.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
    local_3f8.base.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_3f8.base.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_3f8.base.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_3f8.base.m_backend.exp = local_178.exp;
    local_3f8.base.m_backend.neg = local_178.neg;
    local_3f8.base.m_backend.fpclass = local_178.fpclass;
    local_3f8.base.m_backend.prec_elem = local_178.prec_elem;
    local_448.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_448.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_448.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
    local_448.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
    local_448.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
    local_448.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_448.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
    local_448.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
    local_448.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
    local_448.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
    local_448.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
    local_448.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
    local_448.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
    local_448.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
    local_448.m_backend.exp = local_178.exp;
    local_448.m_backend.neg = local_178.neg;
    local_448.m_backend.fpclass = local_178.fpclass;
    local_448.m_backend.prec_elem = local_178.prec_elem;
    local_448.m_backend.data._M_elems._56_5_ = local_3a8.data._M_elems._56_5_;
    local_448.m_backend.data._M_elems[0xf]._1_3_ = local_3a8.data._M_elems[0xf]._1_3_;
    local_3f8.base.m_backend.data._M_elems._56_5_ = local_3a8.data._M_elems._56_5_;
    local_3f8.base.m_backend.data._M_elems[0xf]._1_3_ = local_3a8.data._M_elems[0xf]._1_3_;
  }
  else {
    bVar2 = std::operator==(__lhs,"Tc");
    if (bVar2) goto LAB_0011900f;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_178,__lhs);
    local_448.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_448.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_448.m_backend.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
    local_448.m_backend.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
    local_448.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
    local_448.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
    local_448.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
    local_448.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_448.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
    local_448.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
    local_448.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
    local_448.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
    local_448.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
    local_448.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
    local_448.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
    local_448.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
    local_448.m_backend.exp = local_178.exp;
    local_448.m_backend.neg = local_178.neg;
    local_448.m_backend.fpclass = local_178.fpclass;
    local_448.m_backend.prec_elem = local_178.prec_elem;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_178,&opt->Tmax);
    local_3f8.base.m_backend.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_3f8.base.m_backend.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_3f8.base.m_backend.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
    local_3f8.base.m_backend.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
    local_3f8.base.m_backend.data._M_elems[8] = local_178.data._M_elems[8];
    local_3f8.base.m_backend.data._M_elems[9] = local_178.data._M_elems[9];
    local_3f8.base.m_backend.data._M_elems[10] = local_178.data._M_elems[10];
    local_3f8.base.m_backend.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_3f8.base.m_backend.data._M_elems[4] = local_178.data._M_elems[4];
    local_3f8.base.m_backend.data._M_elems[5] = local_178.data._M_elems[5];
    local_3f8.base.m_backend.data._M_elems[6] = local_178.data._M_elems[6];
    local_3f8.base.m_backend.data._M_elems[7] = local_178.data._M_elems[7];
    local_3f8.base.m_backend.data._M_elems[0] = local_178.data._M_elems[0];
    local_3f8.base.m_backend.data._M_elems[1] = local_178.data._M_elems[1];
    local_3f8.base.m_backend.data._M_elems[2] = local_178.data._M_elems[2];
    local_3f8.base.m_backend.data._M_elems[3] = local_178.data._M_elems[3];
    local_3f8.base.m_backend.exp = local_178.exp;
    local_3f8.base.m_backend.neg = local_178.neg;
    local_3f8.base.m_backend.fpclass = local_178.fpclass;
    local_3f8.base.m_backend.prec_elem = local_178.prec_elem;
    convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_178,&opt->dT);
    local_3a8.data._M_elems[0xc] = local_178.data._M_elems[0xc];
    local_3a8.data._M_elems[0xd] = local_178.data._M_elems[0xd];
    local_3a8.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
    local_3a8.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
    local_3a8.data._M_elems[8] = local_178.data._M_elems[8];
    local_3a8.data._M_elems[9] = local_178.data._M_elems[9];
    local_3a8.data._M_elems[10] = local_178.data._M_elems[10];
    local_3a8.data._M_elems[0xb] = local_178.data._M_elems[0xb];
    local_3a8.data._M_elems[4] = local_178.data._M_elems[4];
    local_3a8.data._M_elems[5] = local_178.data._M_elems[5];
    local_3a8.data._M_elems[6] = local_178.data._M_elems[6];
    local_3a8.data._M_elems[7] = local_178.data._M_elems[7];
    local_3a8.data._M_elems[2] = local_178.data._M_elems[2];
    local_3a8.data._M_elems[3] = local_178.data._M_elems[3];
    local_3a8.exp = local_178.exp;
    local_3a8.neg = local_178.neg;
    local_3a8.fpclass = local_178.fpclass;
    local_3a8.prec_elem = local_178.prec_elem;
  }
  local_178.data._M_elems._0_8_ = local_178.data._M_elems._0_8_ & 0xffffffff00000000;
  tVar3 = boost::multiprecision::operator<(&local_448,(int *)&local_178);
  if (!tVar3) {
    beta.base.m_backend.data._M_elems[0] = 0;
    tVar3 = boost::multiprecision::operator<(&local_3f8.base,(int *)&beta);
    if (!tVar3) {
      tVar3 = boost::multiprecision::operator>(&local_448,&local_3f8.base);
      if (tVar3) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
      }
      else {
        local_178.data._M_elems._0_8_ = local_178.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                            *)&local_3a8,(int *)&local_178);
        lVar1 = std::cout;
        if (!tVar3) {
          *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) &
               0xfffffefb | 0x100;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) =
               100;
          poVar4 = std::operator<<((ostream *)&std::cout,"# lattice: square\n");
          poVar4 = std::operator<<(poVar4,"# precision: ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,100);
          poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
          std::operator<<(poVar4,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
          local_178.data._M_elems[0xf]._1_3_ = local_448.m_backend.data._M_elems[0xf]._1_3_;
          local_178.data._M_elems._56_5_ = local_448.m_backend.data._M_elems._56_5_;
          local_178.data._M_elems[0xc] = local_448.m_backend.data._M_elems[0xc];
          local_178.data._M_elems[0xd] = local_448.m_backend.data._M_elems[0xd];
          local_178.data._M_elems[8] = local_448.m_backend.data._M_elems[8];
          local_178.data._M_elems[9] = local_448.m_backend.data._M_elems[9];
          local_178.data._M_elems[10] = local_448.m_backend.data._M_elems[10];
          local_178.data._M_elems[0xb] = local_448.m_backend.data._M_elems[0xb];
          local_178.data._M_elems[4] = local_448.m_backend.data._M_elems[4];
          local_178.data._M_elems[5] = local_448.m_backend.data._M_elems[5];
          local_178.data._M_elems[6] = local_448.m_backend.data._M_elems[6];
          local_178.data._M_elems[7] = local_448.m_backend.data._M_elems[7];
          local_178.data._M_elems[0] = local_448.m_backend.data._M_elems[0];
          local_178.data._M_elems[1] = local_448.m_backend.data._M_elems[1];
          local_178.data._M_elems[2] = local_448.m_backend.data._M_elems[2];
          local_178.data._M_elems[3] = local_448.m_backend.data._M_elems[3];
          local_178.exp = local_448.m_backend.exp;
          local_178.neg = local_448.m_backend.neg;
          local_178.fpclass = local_448.m_backend.fpclass;
          local_178.prec_elem = local_448.m_backend.prec_elem;
          while( true ) {
            operator*(&f,0.0001,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_3a8);
            operator+(&beta,&local_3f8,&f);
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                *)&local_178,&beta.base);
            if (!tVar3) break;
            operator/(&beta,1,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                               *)&local_178);
            local_1c8 = (square  [8])Jx.base.m_backend.data._M_elems._0_8_;
            auStack_1c0[0] = Jx.base.m_backend.data._M_elems[2];
            auStack_1c0[1] = Jx.base.m_backend.data._M_elems[3];
            local_1b8[0] = Jx.base.m_backend.data._M_elems[4];
            local_1b8[1] = Jx.base.m_backend.data._M_elems[5];
            auStack_1b0[0] = Jx.base.m_backend.data._M_elems[6];
            auStack_1b0[1] = Jx.base.m_backend.data._M_elems[7];
            local_1a8[0] = Jx.base.m_backend.data._M_elems[8];
            local_1a8[1] = Jx.base.m_backend.data._M_elems[9];
            auStack_1a0[0] = Jx.base.m_backend.data._M_elems[10];
            auStack_1a0[1] = Jx.base.m_backend.data._M_elems[0xb];
            local_198[0] = Jx.base.m_backend.data._M_elems[0xc];
            local_198[1] = Jx.base.m_backend.data._M_elems[0xd];
            auStack_190[0] = Jx.base.m_backend.data._M_elems[0xe];
            auStack_190[1] = Jx.base.m_backend.data._M_elems[0xf];
            local_188 = Jx.base.m_backend.exp;
            local_184 = Jx.base.m_backend.neg;
            local_180 = Jx.base.m_backend.fpclass;
            iStack_17c = Jx.base.m_backend.prec_elem;
            local_218.base.m_backend.data._M_elems[0] = Jy.base.m_backend.data._M_elems[0];
            local_218.base.m_backend.data._M_elems[1] = Jy.base.m_backend.data._M_elems[1];
            local_218.base.m_backend.data._M_elems[2] = Jy.base.m_backend.data._M_elems[2];
            local_218.base.m_backend.data._M_elems[3] = Jy.base.m_backend.data._M_elems[3];
            local_218.base.m_backend.data._M_elems[4] = Jy.base.m_backend.data._M_elems[4];
            local_218.base.m_backend.data._M_elems[5] = Jy.base.m_backend.data._M_elems[5];
            local_218.base.m_backend.data._M_elems[6] = Jy.base.m_backend.data._M_elems[6];
            local_218.base.m_backend.data._M_elems[7] = Jy.base.m_backend.data._M_elems[7];
            local_218.base.m_backend.data._M_elems[8] = Jy.base.m_backend.data._M_elems[8];
            local_218.base.m_backend.data._M_elems[9] = Jy.base.m_backend.data._M_elems[9];
            local_218.base.m_backend.data._M_elems[10] = Jy.base.m_backend.data._M_elems[10];
            local_218.base.m_backend.data._M_elems[0xb] = Jy.base.m_backend.data._M_elems[0xb];
            local_218.base.m_backend.data._M_elems[0xc] = Jy.base.m_backend.data._M_elems[0xc];
            local_218.base.m_backend.data._M_elems[0xd] = Jy.base.m_backend.data._M_elems[0xd];
            local_218.base.m_backend.data._M_elems[0xe] = Jy.base.m_backend.data._M_elems[0xe];
            local_218.base.m_backend.data._M_elems[0xf] = Jy.base.m_backend.data._M_elems[0xf];
            local_218.base.m_backend.exp = Jy.base.m_backend.exp;
            local_218.base.m_backend.neg = Jy.base.m_backend.neg;
            local_218.base.m_backend.fpclass = Jy.base.m_backend.fpclass;
            local_218.base.m_backend.prec_elem = Jy.base.m_backend.prec_elem;
            local_268.base.m_backend.data._M_elems[1] = beta.base.m_backend.data._M_elems[1];
            local_268.base.m_backend.data._M_elems[0] = beta.base.m_backend.data._M_elems[0];
            local_268.base.m_backend.data._M_elems[2] = beta.base.m_backend.data._M_elems[2];
            local_268.base.m_backend.data._M_elems[3] = beta.base.m_backend.data._M_elems[3];
            local_268.base.m_backend.data._M_elems[4] = beta.base.m_backend.data._M_elems[4];
            local_268.base.m_backend.data._M_elems[5] = beta.base.m_backend.data._M_elems[5];
            local_268.base.m_backend.data._M_elems[6] = beta.base.m_backend.data._M_elems[6];
            local_268.base.m_backend.data._M_elems[7] = beta.base.m_backend.data._M_elems[7];
            local_268.base.m_backend.data._M_elems[8] = beta.base.m_backend.data._M_elems[8];
            local_268.base.m_backend.data._M_elems[9] = beta.base.m_backend.data._M_elems[9];
            local_268.base.m_backend.data._M_elems[10] = beta.base.m_backend.data._M_elems[10];
            local_268.base.m_backend.data._M_elems[0xb] = beta.base.m_backend.data._M_elems[0xb];
            local_268.base.m_backend.data._M_elems[0xc] = beta.base.m_backend.data._M_elems[0xc];
            local_268.base.m_backend.data._M_elems[0xd] = beta.base.m_backend.data._M_elems[0xd];
            local_268.base.m_backend.data._M_elems[0xe] = beta.base.m_backend.data._M_elems[0xe];
            local_268.base.m_backend.data._M_elems[0xf] = beta.base.m_backend.data._M_elems[0xf];
            local_268.base.m_backend.exp = beta.base.m_backend.exp;
            local_268.base.m_backend.neg = beta.base.m_backend.neg;
            local_268.base.m_backend.fpclass = beta.base.m_backend.fpclass;
            local_268.base.m_backend.prec_elem = beta.base.m_backend.prec_elem;
            ising::free_energy::square::
            infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      (&f,local_1c8,&local_218,&local_268,in_R8);
            poVar4 = std::operator<<((ostream *)&std::cout,"inf inf ");
            poVar4 = boost::multiprecision::operator<<(poVar4,&Jx.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&Jy.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<
                               (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_178);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&beta.base);
            poVar4 = std::operator<<(poVar4,' ');
            poVar4 = boost::multiprecision::operator<<(poVar4,&f.base);
            poVar4 = std::operator<<(poVar4," N/A N/A");
            std::endl<char,std::char_traits<char>>(poVar4);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&local_178,&local_3a8);
          }
          return;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"dT should be positive");
      }
      goto LAB_0011969b;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Temperature should be positive");
LAB_0011969b:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc0(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t beta = 1 / t;
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << beta << ' '
              << f << " N/A N/A" << std::endl;
  }
}